

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Warp(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  int iVar1;
  AActor *this;
  DObject *this_00;
  AActor *reference_00;
  DAngle radiusoffset_00;
  DAngle zofs_00;
  int iVar2;
  MetaClass *pMVar3;
  VMValue *pVVar4;
  bool bVar5;
  bool local_be;
  bool local_bb;
  TAngle<double> local_b8;
  TAngle<double> local_b0;
  AActor *local_a8;
  AActor *reference;
  DAngle pitch;
  double radiusoffset;
  double heightoffset;
  FState *success_state;
  int flags;
  DAngle angle;
  double zofs;
  double yofs;
  double xofs;
  int destination_selector;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1527,"int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1527,"int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = *(AActor **)&param->field_0;
  local_bb = true;
  if (this != (AActor *)0x0) {
    local_bb = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_bb == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1527,"int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1527,"int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar5 = true, param[1].field_0.field_1.atag != 1)) {
    bVar5 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar5) {
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_be = true;
    if (this_00 != (DObject *)0x0) {
      local_be = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_be == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1527,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1527,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (param[2].field_0.field_3.Type != '\x03') {
      __assert_fail("param[paramnum].Type == REGT_POINTER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1527,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 4) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1528,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1528,
                    "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = param[3].field_0.i;
    if (numparam < 5) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar4->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1529,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      yofs = (pVVar4->field_0).f;
    }
    else {
      if (param[4].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1529,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      yofs = param[4].field_0.f;
    }
    if (numparam < 6) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      if ((pVVar4->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152a,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      zofs = (pVVar4->field_0).f;
    }
    else {
      if (param[5].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152a,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      zofs = param[5].field_0.f;
    }
    if (numparam < 7) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      if ((pVVar4->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152b,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      angle.Degrees = (double)(pVVar4->field_0).field_1.a;
    }
    else {
      if (param[6].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152b,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      angle.Degrees = (double)param[6].field_0.field_1.a;
    }
    TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff88);
    if (numparam < 8) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      if ((pVVar4->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152c,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffff88,(pVVar4->field_0).f);
    }
    else {
      if (param[7].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152c,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffff88,param[7].field_0.f);
    }
    if (numparam < 9) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152d,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      success_state._4_4_ = (pVVar4->field_0).i;
    }
    else {
      if (param[8].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152d,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      success_state._4_4_ = param[8].field_0.i;
    }
    if (numparam < 10) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152e,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
      iVar1 = (pVVar4->field_0).i;
      pMVar3 = AActor::GetClass(this);
      heightoffset = (double)FStateLabelStorage::GetState(&StateLabels,iVar1,pMVar3,false);
    }
    else {
      if (param[9].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152e,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      iVar1 = param[9].field_0.i;
      pMVar3 = AActor::GetClass(this);
      heightoffset = (double)FStateLabelStorage::GetState(&StateLabels,iVar1,pMVar3,false);
    }
    if (numparam < 0xb) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
      if ((pVVar4->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152f,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
      radiusoffset = (pVVar4->field_0).f;
    }
    else {
      if (param[10].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x152f,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      radiusoffset = param[10].field_0.f;
    }
    if (numparam < 0xc) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
      if ((pVVar4->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1530,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
      pitch.Degrees = (double)(pVVar4->field_0).field_1.a;
    }
    else {
      if (param[0xb].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1530,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pitch.Degrees = (double)param[0xb].field_0.field_1.a;
    }
    TAngle<double>::TAngle((TAngle<double> *)&reference);
    if (numparam < 0xd) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
      if ((pVVar4->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1531,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
      TAngle<double>::operator=((TAngle<double> *)&reference,(pVVar4->field_0).f);
    }
    else {
      if (param[0xc].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1531,
                      "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      TAngle<double>::operator=((TAngle<double> *)&reference,param[0xc].field_0.f);
    }
    self._4_4_ = numret;
    if (1 < numret) {
      VMReturn::SetInt(ret + 1,0);
      self._4_4_ = 2;
    }
    if (0 < self._4_4_) {
      VMReturn::SetPointer(ret,(void *)0x0,0);
    }
    if ((success_state._4_4_ & 0x2000) == 0) {
      local_a8 = COPY_AAPTR(this,iVar2);
    }
    else {
      local_a8 = SingleActorFromTID(iVar2,this);
    }
    zofs_00.Degrees = angle.Degrees;
    reference_00 = local_a8;
    if (local_a8 != (AActor *)0x0) {
      TAngle<double>::TAngle(&local_b0,(TAngle<double> *)&stack0xffffffffffffff88);
      radiusoffset_00 = pitch;
      TAngle<double>::TAngle(&local_b8,(TAngle<double> *)&reference);
      iVar2 = P_Thing_Warp(this,reference_00,yofs,zofs,zofs_00.Degrees,&local_b0,success_state._4_4_
                           ,radiusoffset,radiusoffset_00.Degrees,&local_b8);
      if (iVar2 != 0) {
        if (heightoffset == 0.0) {
          if (1 < self._4_4_) {
            VMReturn::SetInt(ret + 1,1);
          }
        }
        else if (0 < self._4_4_) {
          VMReturn::SetPointer(ret,(void *)heightoffset,0);
        }
      }
    }
    return self._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1527,"int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Warp)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(destination_selector);
	PARAM_FLOAT_DEF(xofs)				
	PARAM_FLOAT_DEF(yofs)				
	PARAM_FLOAT_DEF(zofs)				
	PARAM_ANGLE_DEF(angle)				
	PARAM_INT_DEF(flags)				
	PARAM_STATE_DEF(success_state)		
	PARAM_FLOAT_DEF(heightoffset)		
	PARAM_FLOAT_DEF(radiusoffset)		
	PARAM_ANGLE_DEF(pitch)				
	
	AActor *reference;

	// A_Teleport and A_Warp were the only codepointers that can state jump
	// *AND* have a meaningful inventory state chain result. Grrr.
	if (numret > 1)
	{
		ret[1].SetInt(false);
		numret = 2;
	}
	if (numret > 0)
	{
		ret[0].SetPointer(NULL, ATAG_STATE);
	}

	if ((flags & WARPF_USETID))
	{
		reference = SingleActorFromTID(destination_selector, self);
	}
	else
	{
		reference = COPY_AAPTR(self, destination_selector);
	}

	//If there is no actor to warp to, fail.
	if (!reference)
	{
		return numret;
	}

	if (P_Thing_Warp(self, reference, xofs, yofs, zofs, angle, flags, heightoffset, radiusoffset, pitch))
	{
		if (success_state)
		{
			// Jumps should never set the result for inventory state chains!
			// in this case, you have the statejump to help you handle all the success anyway.
			if (numret > 0)
			{
				ret[0].SetPointer(success_state, ATAG_STATE);
			}
		}
		else if (numret > 1)
		{
			ret[1].SetInt(true);
		}
	}
	return numret;
}